

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit-array.hpp
# Opt level: O0

bit_array_impl * __thiscall
baryonyx::bit_array_impl::operator=(bit_array_impl *this,bit_array_impl *other)

{
  int __n;
  pointer __first;
  pointer __result;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> local_20;
  bit_array_impl *local_18;
  bit_array_impl *other_local;
  bit_array_impl *this_local;
  
  if (this != other) {
    local_18 = other;
    other_local = this;
    if ((this->m_size != other->m_size) || (this->m_block_size != other->m_block_size)) {
      this->m_size = other->m_size;
      this->m_block_size = other->m_block_size;
      std::make_unique<unsigned_long[]>((size_t)&local_20);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::operator=
                (&this->m_data,&local_20);
      std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr
                (&local_20);
    }
    __first = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
                        (&local_18->m_data);
    __n = this->m_block_size;
    __result = std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::get
                         (&this->m_data);
    std::copy_n<unsigned_long*,int,unsigned_long*>(__first,__n,__result);
  }
  return this;
}

Assistant:

bit_array_impl& operator=(const bit_array_impl& other)
    {
        if (this != &other) {
            if (!(m_size == other.m_size &&
                  m_block_size == other.m_block_size)) {
                m_size = other.m_size;
                m_block_size = other.m_block_size;
                m_data = std::make_unique<underlying_type[]>(m_block_size);
            }
            std::copy_n(other.m_data.get(), m_block_size, m_data.get());
        }

        return *this;
    }